

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

int multi_getsock(Curl_easy *data,curl_socket_t *socks,int numsocks)

{
  connectdata *conn;
  _func_int_connectdata_ptr_curl_socket_t_ptr_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  
  conn = data->easy_conn;
  uVar2 = 0;
  if (conn != (connectdata *)0x0) {
    uVar4 = data->mstate - CURLM_STATE_WAITRESOLVE;
    if (uVar4 < 0xe) {
      conn->data = data;
    }
    switch(uVar4) {
    case 0:
      iVar1 = Curl_resolv_getsock(conn,socks,5);
      return iVar1;
    case 1:
      if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
         ((conn->bits).proxy_ssl_connected[0] == false)) {
        iVar1 = Curl_ssl_getsock(conn,socks,5);
        return iVar1;
      }
      iVar1 = 0;
      uVar2 = 0;
      for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
        if (conn->tempsock[lVar3] != -1) {
          socks[iVar1] = conn->tempsock[lVar3];
          uVar2 = uVar2 | 1 << ((byte)((char)iVar1 + 0x10) & 0x1f);
          iVar1 = iVar1 + 1;
        }
      }
      break;
    case 2:
      *socks = conn->sock[0];
      uVar2 = 1;
      if (conn->connect_state == (http_connect_state *)0x0) {
        uVar2 = 0x10000;
      }
      break;
    case 3:
    case 4:
      iVar1 = Curl_protocol_getsock(conn,socks,5);
      return iVar1;
    case 6:
    case 7:
      iVar1 = Curl_doing_getsock(conn,socks,5);
      return iVar1;
    case 8:
      UNRECOVERED_JUMPTABLE = conn->handler->domore_getsock;
      if (UNRECOVERED_JUMPTABLE != (_func_int_connectdata_ptr_curl_socket_t_ptr_int *)0x0) {
        iVar1 = (*UNRECOVERED_JUMPTABLE)(conn,socks,5);
        return iVar1;
      }
      break;
    case 9:
    case 10:
    case 0xb:
      iVar1 = Curl_single_getsock(conn,socks,5);
      return iVar1;
    }
  }
  return uVar2;
}

Assistant:

static int multi_getsock(struct Curl_easy *data,
                         curl_socket_t *socks, /* points to numsocks number
                                                  of sockets */
                         int numsocks)
{
  /* The no connection case can happen when this is called from
     curl_multi_remove_handle() => singlesocket() => multi_getsock().
  */
  if(!data->easy_conn)
    return 0;

  if(data->mstate > CURLM_STATE_CONNECT &&
     data->mstate < CURLM_STATE_COMPLETED) {
    /* Set up ownership correctly */
    data->easy_conn->data = data;
  }

  switch(data->mstate) {
  default:
#if 0 /* switch back on these cases to get the compiler to check for all enums
         to be present */
  case CURLM_STATE_TOOFAST:  /* returns 0, so will not select. */
  case CURLM_STATE_COMPLETED:
  case CURLM_STATE_MSGSENT:
  case CURLM_STATE_INIT:
  case CURLM_STATE_CONNECT:
  case CURLM_STATE_WAITDO:
  case CURLM_STATE_DONE:
  case CURLM_STATE_LAST:
    /* this will get called with CURLM_STATE_COMPLETED when a handle is
       removed */
#endif
    return 0;

  case CURLM_STATE_WAITRESOLVE:
    return Curl_resolv_getsock(data->easy_conn, socks, numsocks);

  case CURLM_STATE_PROTOCONNECT:
  case CURLM_STATE_SENDPROTOCONNECT:
    return Curl_protocol_getsock(data->easy_conn, socks, numsocks);

  case CURLM_STATE_DO:
  case CURLM_STATE_DOING:
    return Curl_doing_getsock(data->easy_conn, socks, numsocks);

  case CURLM_STATE_WAITPROXYCONNECT:
    return waitproxyconnect_getsock(data->easy_conn, socks, numsocks);

  case CURLM_STATE_WAITCONNECT:
    return waitconnect_getsock(data->easy_conn, socks, numsocks);

  case CURLM_STATE_DO_MORE:
    return domore_getsock(data->easy_conn, socks, numsocks);

  case CURLM_STATE_DO_DONE: /* since is set after DO is completed, we switch
                               to waiting for the same as the *PERFORM
                               states */
  case CURLM_STATE_PERFORM:
  case CURLM_STATE_WAITPERFORM:
    return Curl_single_getsock(data->easy_conn, socks, numsocks);
  }

}